

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2ParallelRead.cpp
# Opt level: O2

expected<idx2::chunk_cache,_idx2::idx2_err_code> *
idx2::ParallelReadChunk
          (expected<idx2::chunk_cache,_idx2::idx2_err_code> *__return_storage_ptr__,idx2_file *Idx2,
          decode_data *D,u64 Brick,i8 Level,i8 Subband,i16 BpKey)

{
  byte *pbVar1;
  FILE *pFVar2;
  i64 ChunkCache_00;
  char cVar3;
  bool bVar4;
  int iVar5;
  FILE *pFVar6;
  __off_t _Var7;
  __off_t _Var8;
  ulong uVar9;
  long lVar10;
  byte bVar11;
  unsigned_long *Key;
  uint uVar12;
  undefined7 in_register_00000081;
  chunk_cache *Val;
  undefined7 in_register_00000089;
  ulong *puVar13;
  ulong *puVar14;
  ulong uVar15;
  ulong uVar16;
  expected<idx2::chunk_cache,_idx2::idx2_err_code> *peVar17;
  size_t sVar18;
  long lVar19;
  bucket_status *pbVar20;
  int I;
  ulong uVar21;
  long *in_FS_OFFSET;
  stref sVar22;
  FILE *Fp;
  expected<idx2::chunk_cache,_idx2::idx2_err_code> *local_338;
  int NChunks;
  FILE *local_328;
  undefined4 local_31c;
  timer IOTimer_1;
  ulong *local_300;
  ulong local_2f8;
  uint local_2f0;
  timer IOTimer;
  file_id FileId;
  iterator FileCacheIt;
  u64 ChunkAddress;
  chunk_cache *pcStack_280;
  mallocator *local_278;
  FILE *local_270;
  u64 local_268;
  u64 ChunkAddr;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:78:3)>
  __ScopeGuard__78;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:71:3)>
  __ScopeGuard__71;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:67:3)>
  __ScopeGuard__67;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:53:3)>
  __ScopeGuard__53;
  int ChunkSizesSz;
  int ChunkAddrsSz;
  int S;
  buffer local_208;
  FILE *Fp_1;
  i64 iStack_1e0;
  mallocator *local_1d8;
  unique_lock<std::mutex> Lock;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:163:5)>
  __ScopeGuard__163;
  file_cache FileCache;
  chunk_cache ChunkCache;
  
  local_338 = __return_storage_ptr__;
  std::unique_lock<std::mutex>::unique_lock(&Lock,&D->FileCacheMutex);
  local_328 = (FILE *)CONCAT44(local_328._4_4_,(int)CONCAT71(in_register_00000081,Level));
  Key = (unsigned_long *)(CONCAT71(in_register_00000081,Level) & 0xffffffff);
  local_31c = (undefined4)CONCAT71(in_register_00000089,Subband);
  local_268 = Brick;
  ConstructFilePath(&FileId,Idx2,Brick,(i8)Key,Subband,BpKey);
  Lookup<unsigned_long,idx2::file_cache>
            (&FileCacheIt,(idx2 *)&D->FileCacheTable,
             (hash_table<unsigned_long,_idx2::file_cache> *)&FileId.Id,Key);
  clock_gettime(1,(timespec *)&IOTimer);
  pbVar20 = (FileCacheIt.Ht)->Stats;
  if ((pbVar20[FileCacheIt.Idx] == Occupied) && ((FileCacheIt.Val)->DataCached == true)) {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x33;
    peVar17 = local_338;
LAB_00175c27:
    if (pbVar20[FileCacheIt.Idx] == Occupied) {
      cVar3 = (char)local_328;
      if ('\x0f' < cVar3) {
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]");
      }
      uVar9 = (ulong)(Idx2->BricksPerChunk).Arr[cVar3];
      lVar10 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      bVar11 = -(uVar9 == 0) | (byte)lVar10;
      ChunkAddress = ((ulong)((ushort)BpKey & 0xfff) |
                     (long)((int)(char)local_31c << 0xc) + ((ulong)((uint)local_328 & 0xff) << 0x3c)
                     ) + (local_268 >> ((1L << (bVar11 & 0x3f) != uVar9) + bVar11 & 0x3f)) * 0x40000
      ;
      Lookup<unsigned_long,idx2::chunk_cache>
                ((iterator *)&FileCache,(idx2 *)&(FileCacheIt.Val)->ChunkCaches,
                 (hash_table<unsigned_long,_idx2::chunk_cache> *)&ChunkAddress,
                 (unsigned_long *)ChunkAddress);
      ChunkCache_00 = FileCache.ChunkOffsets.Buffer.Bytes;
      if (*(char *)((long)FileCache.ChunkOffsets.Buffer.Alloc[2]._vptr_allocator +
                   FileCache.ChunkOffsets.Size) == '\x02') {
        if (*(long *)(FileCache.ChunkOffsets.Buffer.Bytes + 0x70) == 0) {
          clock_gettime(1,(timespec *)&IOTimer_1);
          local_328 = fopen(FileId.Name.field_0.Ptr,"rb");
          __ScopeGuard__163.Func.Fp = &Fp_1;
          __ScopeGuard__163.Dismissed = false;
          Fp_1 = (FILE *)local_328;
          if (local_328 == (FILE *)0x0) {
            *(char **)(*in_FS_OFFSET + -0xb80) =
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
            ;
            *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0xa5;
            sVar22 = ToString(FileNotFound);
            lVar10 = *in_FS_OFFSET;
            iVar5 = snprintf((char *)(lVar10 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                             (ulong)(uint)sVar22.Size,sVar22.field_0.Ptr,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
                             ,0xa5);
            snprintf((char *)(lVar10 + -0xf80) + iVar5,0x400 - (long)iVar5,"File: %s\n",
                     FileId.Name.field_0.Ptr);
            peVar17->_vptr_expected = (_func_int **)&PTR__expected_001aebe8;
            (peVar17->field_1).Err.Msg = "File: %s\n";
            (peVar17->field_1).Err.StrGened = true;
            *(undefined2 *)((long)&peVar17->field_1 + 8) = 0x25;
            *(undefined4 *)((long)&peVar17->field_1 + 0xb) =
                 FileCache.ChunkOffsets.Buffer.Data._0_4_;
            *(undefined1 *)((long)&peVar17->field_1 + 0xf) =
                 FileCache.ChunkOffsets.Buffer.Data._4_1_;
            peVar17->Ok = false;
          }
          else {
            lVar10 = (long)*(int *)ChunkCache_00;
            pbVar1 = ((FileCacheIt.Val)->ChunkOffsets).Buffer.Data;
            if (lVar10 < 1) {
              lVar19 = 0;
            }
            else {
              lVar19 = *(long *)(pbVar1 + lVar10 * 8 + -8);
            }
            lVar10 = *(long *)(pbVar1 + lVar10 * 8);
            fseeko(local_328,lVar19,0);
            bitstream::bitstream((bitstream *)&FileCache);
            Mallocator();
            (**(code **)Mallocator::Instance.super_allocator._vptr_allocator)
                      (&Mallocator::Instance,&FileCache,(lVar10 - lVar19) + 8);
            FileCache.ChunkOffsets.Size =
                 CONCAT44(FileCache.ChunkOffsets.Buffer.Data._4_4_,
                          FileCache.ChunkOffsets.Buffer.Data._0_4_);
            FileCache.ChunkOffsets.Alloc._0_4_ = 0;
            FileCache.ChunkOffsets.Capacity = 0;
            fread((void *)FileCache.ChunkOffsets.Size,FileCache.ChunkOffsets.Buffer.Bytes,1,
                  (FILE *)Fp_1);
            LOCK();
            (D->BytesData_).super___atomic_base<unsigned_long>._M_i =
                 (D->BytesData_).super___atomic_base<unsigned_long>._M_i +
                 FileCache.ChunkOffsets.Buffer.Bytes;
            UNLOCK();
            clock_gettime(1,(timespec *)&ChunkCache);
            LOCK();
            (D->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
                 (D->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
                 (long)((double)(CONCAT44(ChunkCache._4_4_,ChunkCache.ChunkPos) -
                                IOTimer_1.Start.tv_sec) * 1000000000.0 +
                       (double)((long)ChunkCache.Bricks.Buffer.Data - IOTimer_1.Start.tv_nsec));
            UNLOCK();
            uVar9 = (ulong)(Idx2->BricksPerChunk).Arr[cVar3];
            lVar10 = 0x3f;
            if (uVar9 != 0) {
              for (; uVar9 >> lVar10 == 0; lVar10 = lVar10 + -1) {
              }
            }
            bVar11 = -(uVar9 == 0) | (byte)lVar10;
            DecompressChunk((bitstream *)&FileCache,(chunk_cache *)ChunkCache_00,ChunkAddress,
                            (int)(char)((1L << (bVar11 & 0x3f) != uVar9) + bVar11));
            peVar17 = local_338;
          }
          pFVar6 = local_328;
          scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp:163:5)>
          ::~scope_guard(&__ScopeGuard__163);
          if (pFVar6 == (FILE *)0x0) goto LAB_001760e5;
        }
        peVar17->_vptr_expected = (_func_int **)&PTR__expected_001aebe8;
        memcpy(&peVar17->field_1,(void *)ChunkCache_00,0xa0);
        bVar4 = true;
      }
      else {
        *(char **)(*in_FS_OFFSET + -0xb80) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x9d;
        peVar17->_vptr_expected = (_func_int **)&PTR__expected_001aebe8;
        (peVar17->field_1).Err.Msg = "";
        (peVar17->field_1).Err.StrGened = false;
        *(undefined2 *)((long)&peVar17->field_1 + 8) = 0x23;
        bVar4 = false;
      }
      peVar17->Ok = bVar4;
      goto LAB_001760e5;
    }
  }
  else {
    pFVar6 = fopen(FileId.Name.field_0.Ptr,"rb");
    __ScopeGuard__53.Func.Fp = &Fp;
    __ScopeGuard__53.Dismissed = false;
    Fp = (FILE *)pFVar6;
    if (pFVar6 == (FILE *)0x0) {
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x36;
      sVar22 = ToString(FileNotFound);
      peVar17 = local_338;
      lVar10 = *in_FS_OFFSET;
      iVar5 = snprintf((char *)(lVar10 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                       (ulong)(uint)sVar22.Size,sVar22.field_0.Ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
                       ,0x36);
      snprintf((char *)(lVar10 + -0xf80) + iVar5,0x400 - (long)iVar5,"File: %s");
    }
    else {
      local_270 = pFVar6;
      fseeko(pFVar6,0,2);
      _Var7 = ftello((FILE *)Fp);
      pFVar2 = Fp;
      S = 0;
      _Var8 = ftello((FILE *)Fp);
      fseeko((FILE *)pFVar2,_Var8 + -4,0);
      fread(&S,4,1,(FILE *)pFVar2);
      fseeko((FILE *)pFVar2,_Var8 + -4,0);
      fseeko((FILE *)Fp,_Var7 - S,0);
      pFVar2 = Fp;
      NChunks = 0;
      _Var7 = ftello((FILE *)Fp);
      fseeko((FILE *)pFVar2,_Var7 + -4,0);
      fread(&NChunks,4,1,(FILE *)pFVar2);
      fseeko((FILE *)pFVar2,_Var7 + -4,0);
      pFVar2 = Fp;
      _Var7 = ftello((FILE *)Fp);
      fseeko((FILE *)pFVar2,_Var7 + -4,0);
      fread(&ChunkAddrsSz,4,1,(FILE *)pFVar2);
      fseeko((FILE *)pFVar2,_Var7 + -4,0);
      Mallocator();
      ChunkAddress = 0;
      pcStack_280 = (chunk_cache *)0x0;
      local_278 = &Mallocator::Instance;
      __ScopeGuard__67.Dismissed = false;
      sVar18 = (size_t)ChunkAddrsSz;
      __ScopeGuard__67.Func.CpresChunkAddrs = (buffer *)&ChunkAddress;
      Mallocator();
      AllocBuf((buffer *)&ChunkAddress,sVar18,&Mallocator::Instance.super_allocator);
      pFVar2 = Fp;
      if ((long)pcStack_280 < (long)sVar18) {
LAB_00176107:
        __assert_fail("Sz <= Size(*Buf)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.h"
                      ,0x9d,"void idx2::ReadBackwardBuffer(FILE *, buffer *, i64)");
      }
      _Var7 = ftello((FILE *)Fp);
      fseeko((FILE *)pFVar2,_Var7 - sVar18,0);
      fread((void *)ChunkAddress,sVar18,1,(FILE *)pFVar2);
      fseeko((FILE *)pFVar2,_Var7 - sVar18,0);
      LOCK();
      (D->BytesData_).super___atomic_base<unsigned_long>._M_i =
           (D->BytesData_).super___atomic_base<unsigned_long>._M_i + sVar18;
      UNLOCK();
      clock_gettime(1,(timespec *)&FileCache);
      LOCK();
      (D->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
           (D->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
           (long)((double)(CONCAT44(FileCache.ChunkOffsets.Buffer.Data._4_4_,
                                    FileCache.ChunkOffsets.Buffer.Data._0_4_) - IOTimer.Start.tv_sec
                          ) * 1000000000.0 +
                 (double)(FileCache.ChunkOffsets.Buffer.Bytes - IOTimer.Start.tv_nsec));
      UNLOCK();
      Mallocator();
      Fp_1 = (FILE *)0x0;
      iStack_1e0 = 0;
      local_1d8 = &Mallocator::Instance;
      __ScopeGuard__71.Dismissed = false;
      lVar10 = (long)NChunks;
      __ScopeGuard__71.Func.ChunkAddrsBuf = (buffer *)&Fp_1;
      Mallocator();
      AllocBuf((buffer *)&Fp_1,lVar10 << 3,&Mallocator::Instance.super_allocator);
      DecompressBufZstd((buffer *)&ChunkAddress,(buffer *)&Fp_1);
      clock_gettime(1,(timespec *)&FileCache);
      clock_gettime(1,(timespec *)&IOTimer);
      pFVar2 = Fp;
      ChunkSizesSz = 0;
      _Var7 = ftello((FILE *)Fp);
      fseeko((FILE *)pFVar2,_Var7 + -4,0);
      fread(&ChunkSizesSz,4,1,(FILE *)pFVar2);
      fseeko((FILE *)pFVar2,_Var7 + -4,0);
      Mallocator();
      local_208.Data = (byte *)0x0;
      local_208.Bytes = 0;
      local_208.Alloc = &Mallocator::Instance.super_allocator;
      __ScopeGuard__78.Dismissed = false;
      sVar18 = (size_t)ChunkSizesSz;
      __ScopeGuard__78.Func.ChunkSizesBuf = &local_208;
      Mallocator();
      AllocBuf(&local_208,sVar18,&Mallocator::Instance.super_allocator);
      bitstream::bitstream((bitstream *)&IOTimer_1);
      pFVar2 = Fp;
      if (local_208.Bytes < (long)sVar18) goto LAB_00176107;
      _Var7 = ftello((FILE *)Fp);
      fseeko((FILE *)pFVar2,_Var7 - sVar18,0);
      fread(local_208.Data,sVar18,1,(FILE *)pFVar2);
      fseeko((FILE *)pFVar2,_Var7 - sVar18,0);
      LOCK();
      (D->BytesData_).super___atomic_base<unsigned_long>._M_i =
           (D->BytesData_).super___atomic_base<unsigned_long>._M_i + sVar18;
      UNLOCK();
      clock_gettime(1,(timespec *)&FileCache);
      LOCK();
      (D->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
           (D->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
           (long)((double)(CONCAT44(FileCache.ChunkOffsets.Buffer.Data._4_4_,
                                    FileCache.ChunkOffsets.Buffer.Data._0_4_) - IOTimer.Start.tv_sec
                          ) * 1000000000.0 +
                 (double)(FileCache.ChunkOffsets.Buffer.Bytes - IOTimer.Start.tv_nsec));
      UNLOCK();
      IOTimer_1.Start.tv_sec = (__time_t)local_208.Data;
      IOTimer_1.Start.tv_nsec = local_208.Bytes;
      local_300 = (ulong *)local_208.Data;
      local_2f8 = *(ulong *)local_208.Data;
      local_2f0 = 0;
      file_cache::file_cache(&FileCache);
      Mallocator();
      Init<unsigned_long,idx2::chunk_cache>
                (&FileCache.ChunkCaches,10,&Mallocator::Instance.super_allocator);
      uVar9 = (ulong)(uint)NChunks;
      lVar10 = 0;
      for (uVar21 = 0; uVar21 != uVar9; uVar21 = uVar21 + 1) {
        bVar11 = 0;
        lVar19 = 0;
        puVar14 = local_300;
        uVar15 = local_2f8;
        do {
          puVar13 = puVar14;
          if (0x39 < (int)local_2f0) {
            puVar13 = (ulong *)((long)puVar14 + (ulong)(local_2f0 >> 3));
            uVar15 = *(ulong *)((long)puVar14 + (ulong)(local_2f0 >> 3));
            local_2f0 = local_2f0 & 7;
            local_300 = puVar13;
            local_2f8 = uVar15;
          }
          uVar16 = uVar15 >> ((byte)local_2f0 & 0x3f);
          uVar12 = local_2f0 + 7;
          puVar14 = puVar13;
          if (0x38 < (int)local_2f0) {
            puVar14 = (ulong *)((long)puVar13 + (ulong)(uVar12 >> 3));
            uVar15 = *(ulong *)((long)puVar13 + (ulong)(uVar12 >> 3));
            uVar12 = 0;
            local_300 = puVar14;
            local_2f8 = uVar15;
          }
          lVar19 = lVar19 + ((uVar16 & bitstream::Masks.Arr[7]) << (bVar11 & 0x3f));
          local_2f0 = uVar12 + 1;
          bVar11 = bVar11 + 7;
        } while ((uVar15 >> ((byte)uVar12 & 0x3f) & bitstream::Masks.Arr[1]) != 0);
        ChunkAddr = *(u64 *)(Fp_1 + uVar21 * 8);
        Val = (chunk_cache *)bitstream::Masks.Arr[7];
        chunk_cache::chunk_cache(&ChunkCache);
        ChunkCache.ChunkPos = (i32)uVar21;
        Insert<unsigned_long,idx2::chunk_cache>
                  ((iterator *)&__ScopeGuard__163,(idx2 *)&FileCache.ChunkCaches,
                   (hash_table<unsigned_long,_idx2::chunk_cache> *)&ChunkAddr,
                   (unsigned_long *)&ChunkCache,Val);
        if (FileCache.ChunkOffsets.Capacity <= FileCache.ChunkOffsets.Size) {
          GrowCapacity<long>(&FileCache.ChunkOffsets,0);
        }
        lVar10 = lVar10 + lVar19;
        *(long *)(CONCAT44(FileCache.ChunkOffsets.Buffer.Data._4_4_,
                           FileCache.ChunkOffsets.Buffer.Data._0_4_) +
                 FileCache.ChunkOffsets.Size * 8) = lVar10;
        FileCache.ChunkOffsets.Size = FileCache.ChunkOffsets.Size + 1;
      }
      if ((FileCacheIt.Ht)->Stats[FileCacheIt.Idx] == Occupied) {
        ((FileCacheIt.Val)->ChunkCaches).Stats = FileCache.ChunkCaches.Stats;
        ((FileCacheIt.Val)->ChunkCaches).Size = FileCache.ChunkCaches.Size;
        ((FileCacheIt.Val)->ChunkCaches).LogCapacity = FileCache.ChunkCaches.LogCapacity;
        ((FileCacheIt.Val)->ChunkCaches).Alloc = FileCache.ChunkCaches.Alloc;
        ((FileCacheIt.Val)->ChunkCaches).Keys = FileCache.ChunkCaches.Keys;
        ((FileCacheIt.Val)->ChunkCaches).Vals = FileCache.ChunkCaches.Vals;
        ((FileCacheIt.Val)->ChunkCaches).Stats = FileCache.ChunkCaches.Stats;
        ((FileCacheIt.Val)->ChunkCaches).Size = FileCache.ChunkCaches.Size;
        ((FileCacheIt.Val)->ChunkOffsets).Buffer.Data =
             (byte *)CONCAT44(FileCache.ChunkOffsets.Buffer.Data._4_4_,
                              FileCache.ChunkOffsets.Buffer.Data._0_4_);
        ((FileCacheIt.Val)->ChunkOffsets).Buffer.Bytes = FileCache.ChunkOffsets.Buffer.Bytes;
        ((FileCacheIt.Val)->ChunkOffsets).Buffer.Alloc = FileCache.ChunkOffsets.Buffer.Alloc;
        ((FileCacheIt.Val)->ChunkOffsets).Size = FileCache.ChunkOffsets.Size;
        ((FileCacheIt.Val)->ChunkOffsets).Buffer.Alloc = FileCache.ChunkOffsets.Buffer.Alloc;
        ((FileCacheIt.Val)->ChunkOffsets).Size = FileCache.ChunkOffsets.Size;
        ((FileCacheIt.Val)->ChunkOffsets).Capacity = FileCache.ChunkOffsets.Capacity;
        ((FileCacheIt.Val)->ChunkOffsets).Alloc =
             (allocator *)
             CONCAT44(FileCache.ChunkOffsets.Alloc._4_4_,FileCache.ChunkOffsets.Alloc._0_4_);
      }
      else {
        Insert<unsigned_long,idx2::file_cache>(&FileCacheIt,&FileId.Id,&FileCache);
      }
      peVar17 = local_338;
      (FileCacheIt.Val)->DataCached = true;
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x71;
      scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp:78:3)>
      ::~scope_guard(&__ScopeGuard__78);
      scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp:71:3)>
      ::~scope_guard(&__ScopeGuard__71);
      scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp:67:3)>
      ::~scope_guard(&__ScopeGuard__67);
      pFVar6 = local_270;
    }
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp:53:3)>
    ::~scope_guard(&__ScopeGuard__53);
    if (pFVar6 != (FILE *)0x0) {
      pbVar20 = (FileCacheIt.Ht)->Stats;
      goto LAB_00175c27;
    }
  }
  *(char **)(*in_FS_OFFSET + -0xb80) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x94;
  sVar22 = ToString(FileNotFound);
  lVar10 = *in_FS_OFFSET;
  iVar5 = snprintf((char *)(lVar10 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                   (ulong)(uint)sVar22.Size,sVar22.field_0.Ptr,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
                   ,0x94);
  snprintf((char *)(lVar10 + -0xf80) + iVar5,0x400 - (long)iVar5,"File: %s\n",
           FileId.Name.field_0.Ptr);
  peVar17->_vptr_expected = (_func_int **)&PTR__expected_001aebe8;
  (peVar17->field_1).Err.Msg = "File: %s\n";
  (peVar17->field_1).Err.StrGened = true;
  *(undefined2 *)((long)&peVar17->field_1 + 8) = 0x25;
  *(undefined4 *)((long)&peVar17->field_1 + 0xb) = FileCache.ChunkOffsets.Buffer.Data._0_4_;
  *(undefined1 *)((long)&peVar17->field_1 + 0xf) = FileCache.ChunkOffsets.Buffer.Data._4_1_;
  peVar17->Ok = false;
LAB_001760e5:
  std::unique_lock<std::mutex>::~unique_lock(&Lock);
  return peVar17;
}

Assistant:

expected<chunk_cache, idx2_err_code>
ParallelReadChunk(const idx2_file& Idx2, decode_data* D, u64 Brick, i8 Level, i8 Subband, i16 BpKey)
{
#if VISUS_IDX2
  if (Idx2.external_read)
  {
    std::unique_lock<std::mutex> Lock(D->FileCacheMutex);
    u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, BpKey);
    auto ChunkCacheIt = Lookup(D->FileCache.ChunkCaches, ChunkAddress);
    if (ChunkCacheIt)
      return *ChunkCacheIt.Val;

    bitstream ChunkStream;
    bool Result = Idx2.external_read(Idx2, ChunkStream.Stream, ChunkAddress).get();
    idx2_ReturnErrorIf(!Result, idx2_err_code::ChunkNotFound);

    // decompress part
    chunk_cache ChunkCache;
    DecompressChunk(&ChunkStream, &ChunkCache, ChunkAddress, Log2Ceil(Idx2.BricksPerChunk[Level]));
    Insert(&ChunkCacheIt, ChunkAddress, ChunkCache);
    return *ChunkCacheIt.Val;
  }
#endif

  std::unique_lock<std::mutex> Lock(D->FileCacheMutex);
  file_id FileId = ConstructFilePath(Idx2, Brick, Level, Subband, BpKey);
  // TODO: lock and be careful about invalidated pointer
  auto FileCacheIt = Lookup(D->FileCacheTable, FileId.Id);
  auto Result = ParallelReadFile(Idx2, D, &FileCacheIt, FileId);
  if (!Result || !FileCacheIt)
    return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);

  /* find the appropriate chunk */
  u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, BpKey);
  const file_cache* FileCache = FileCacheIt.Val;
  decltype(FileCache->ChunkCaches)::iterator ChunkCacheIt;
  // TODO: lock and be careful about invalidated pointer
  ChunkCacheIt = Lookup(FileCache->ChunkCaches, ChunkAddress);
  if (!ChunkCacheIt)
    return idx2_Error(idx2_err_code::ChunkNotFound);
  chunk_cache* ChunkCache = ChunkCacheIt.Val;
  if (Size(ChunkCache->ChunkStream.Stream) == 0) // chunk has not been loaded
  {
    timer IOTimer;
    StartTimer(&IOTimer);
    idx2_RAII(FILE*, Fp = fopen(FileId.Name.ConstPtr, "rb"), , if (Fp) fclose(Fp));
    if (!Fp)
      return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);
    i32 ChunkPos = ChunkCache->ChunkPos;
    i64 ChunkOffset = ChunkPos > 0 ? FileCache->ChunkOffsets[ChunkPos - 1] : 0;
    i64 ChunkSize = FileCache->ChunkOffsets[ChunkPos] - ChunkOffset;
    idx2_FSeek(Fp, ChunkOffset, SEEK_SET);
    bitstream ChunkStream;
    // NOTE: not a memory leak since we will keep track of this in ChunkCache
    InitWrite(&ChunkStream, ChunkSize);
    ReadBuffer(Fp, &ChunkStream.Stream);
    D->BytesData_ += Size(ChunkStream.Stream);
    D->DecodeIOTime_ += ElapsedTime(&IOTimer);
    // TODO: check for error
    DecompressChunk(&ChunkStream, ChunkCache, ChunkAddress, Log2Ceil(Idx2.BricksPerChunk[Level]));
  }

  return *ChunkCache;
}